

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::program_binary(NegativeTestContext *ctx)

{
  undefined *puVar1;
  GLint bufSize_00;
  GLenum GVar2;
  GLsizei program;
  deUint64 dVar3;
  deUint32 dVar4;
  deBool dVar5;
  RenderContext *renderCtx;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *this;
  reference pvVar8;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  GLint local_240;
  GLint local_23c;
  GLint linkStatus;
  GLint bufSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaryBuf;
  GLenum local_218;
  GLsizei binaryLength;
  GLenum binaryFormat;
  GLuint dummyShader;
  GLuint dstProgram;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram srcProgram;
  NegativeTestContext *ctx_local;
  
  srcProgram.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dstProgram,puVar1,(allocator<char> *)((long)&dummyShader + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,(string *)&dstProgram);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&dstProgram);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dummyShader + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  binaryFormat = glu::CallLogWrapper::glCreateProgram
                           ((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs);
  binaryLength = glu::CallLogWrapper::glCreateShader
                           ((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs,0x8b31);
  local_218 = 0xffffffff;
  binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus);
  dVar3 = srcProgram.m_program.m_info.linkTimeUs;
  local_23c = -1;
  local_240 = -1;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar3,dVar4,0x8741,&local_23c);
  dVar3 = srcProgram.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glGetProgramiv((CallLogWrapper *)dVar3,dVar4,0x8b82,&local_240);
  pTVar6 = glu::CallLogWrapper::getLog((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_3c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_3c0,(char (*) [31])"// GL_PROGRAM_BINARY_LENGTH = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_23c);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  pTVar6 = glu::CallLogWrapper::getLog((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs);
  tcu::TestLog::operator<<(&local_540,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [21])"// GL_LINK_STATUS = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_240);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_540);
  while( true ) {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (local_23c < 0)) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      if (0 < local_23c) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus,
                   (long)local_23c);
        dVar3 = srcProgram.m_program.m_info.linkTimeUs;
        dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
        bufSize_00 = local_23c;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus,0);
        glu::CallLogWrapper::glGetProgramBinary
                  ((CallLogWrapper *)dVar3,dVar4,bufSize_00,
                   (GLsizei *)
                   ((long)&binaryBuf.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4),&local_218,pvVar8);
        NegativeTestContext::expectError
                  ((NegativeTestContext *)srcProgram.m_program.m_info.linkTimeUs,0);
        dVar3 = srcProgram.m_program.m_info.linkTimeUs;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_560,
                   "GL_INVALID_OPERATION is generated if program is not the name of an existing program object."
                   ,&local_561);
        NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_560);
        std::__cxx11::string::~string((string *)&local_560);
        std::allocator<char>::~allocator(&local_561);
        dVar3 = srcProgram.m_program.m_info.linkTimeUs;
        program = binaryLength;
        GVar2 = local_218;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus,0);
        glu::CallLogWrapper::glProgramBinary
                  ((CallLogWrapper *)dVar3,program,GVar2,pvVar8,
                   binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        NegativeTestContext::expectError
                  ((NegativeTestContext *)srcProgram.m_program.m_info.linkTimeUs,0x502);
        NegativeTestContext::endSection
                  ((NegativeTestContext *)srcProgram.m_program.m_info.linkTimeUs);
        dVar3 = srcProgram.m_program.m_info.linkTimeUs;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,
                   "GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation."
                   ,&local_589);
        NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
        dVar3 = srcProgram.m_program.m_info.linkTimeUs;
        GVar2 = binaryFormat;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus,0);
        glu::CallLogWrapper::glProgramBinary
                  ((CallLogWrapper *)dVar3,GVar2,0xffffffff,pvVar8,
                   binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        NegativeTestContext::expectError
                  ((NegativeTestContext *)srcProgram.m_program.m_info.linkTimeUs,0x500);
        NegativeTestContext::endSection
                  ((NegativeTestContext *)srcProgram.m_program.m_info.linkTimeUs);
      }
      glu::CallLogWrapper::glDeleteShader
                ((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs,binaryLength);
      glu::CallLogWrapper::glDeleteProgram
                ((CallLogWrapper *)srcProgram.m_program.m_info.linkTimeUs,binaryFormat);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&linkStatus);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"bufSize >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0x209);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram		srcProgram		(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	GLuint					dstProgram		= ctx.glCreateProgram();
	GLuint					dummyShader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLenum					binaryFormat	= -1;
	GLsizei					binaryLength	= -1;
	std::vector<deUint8>	binaryBuf;
	GLint					bufSize			= -1;
	GLint					linkStatus		= -1;

	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;

	TCU_CHECK(bufSize >= 0);
	if (bufSize > 0)
	{
		binaryBuf.resize(bufSize);
		ctx.glGetProgramBinary	(srcProgram.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryBuf[0]);
		ctx.expectError			(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if program is not the name of an existing program object.");
		ctx.glProgramBinary		(dummyShader, binaryFormat, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation.");
		ctx.glProgramBinary		(dstProgram, -1, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.glDeleteShader(dummyShader);
	ctx.glDeleteProgram(dstProgram);
}